

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestInfo::Skip(TestInfo *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *pUVar2;
  TestPartResultReporterInterface **ppTVar3;
  undefined1 local_90 [8];
  TestPartResult test_part_result;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    pUVar2 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_info_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[8])(pTVar1,this);
    TestPartResult::TestPartResult
              ((TestPartResult *)local_90,kSkip,(this->location_).file._M_dataplus._M_p,
               (this->location_).line,"");
    ppTVar3 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                        (&pUVar2->per_thread_test_part_result_reporter_);
    (*(*ppTVar3)->_vptr_TestPartResultReporterInterface[2])(*ppTVar3,local_90);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar1,this);
    pUVar2->current_test_info_ = (TestInfo *)0x0;
    if ((size_type *)test_part_result.summary_.field_2._8_8_ !=
        &test_part_result.message_._M_string_length) {
      operator_delete((void *)test_part_result.summary_.field_2._8_8_,
                      test_part_result.message_._M_string_length + 1);
    }
    if ((size_type *)test_part_result._40_8_ != &test_part_result.summary_._M_string_length) {
      operator_delete((void *)test_part_result._40_8_,test_part_result.summary_._M_string_length + 1
                     );
    }
    if ((size_type *)test_part_result._0_8_ != &test_part_result.file_name_._M_string_length) {
      operator_delete((void *)test_part_result._0_8_,
                      test_part_result.file_name_._M_string_length + 1);
    }
  }
  return;
}

Assistant:

void TestInfo::Skip() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TestPartResult test_part_result =
      TestPartResult(TestPartResult::kSkip, this->file(), this->line(), "");
  impl->GetTestPartResultReporterForCurrentThread()->ReportTestPartResult(
      test_part_result);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);
  impl->set_current_test_info(nullptr);
}